

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O0

void __thiscall
AHexenArmor::AbsorbDamage(AHexenArmor *this,int damage,FName *damageType,int *newdamage)

{
  uint uVar1;
  bool bVar2;
  AInventory *pAVar3;
  FName local_44;
  int local_40;
  int local_3c;
  int saved;
  int i;
  double savedPercent;
  uint *local_28;
  int *newdamage_local;
  FName *damageType_local;
  AHexenArmor *pAStack_10;
  int damage_local;
  AHexenArmor *this_local;
  
  local_28 = (uint *)newdamage;
  newdamage_local = &damageType->Index;
  damageType_local._4_4_ = damage;
  pAStack_10 = this;
  FName::FName((FName *)((long)&savedPercent + 4),damageType);
  bVar2 = DamageTypeDefinition::IgnoreArmor((FName *)((long)&savedPercent + 4));
  if (!bVar2) {
    _saved = this->Slots[0] + this->Slots[1] + this->Slots[2] + this->Slots[3] + this->Slots[4];
    if ((_saved != 0.0) || (NAN(_saved))) {
      if (100.0 < _saved) {
        _saved = 100.0;
      }
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        if ((this->Slots[local_3c] != 0.0) || (NAN(this->Slots[local_3c]))) {
          if ((int)damageType_local._4_4_ < 10000) {
            this->Slots[local_3c] =
                 this->Slots[local_3c] -
                 ((double)(int)damageType_local._4_4_ * this->SlotsIncrement[local_3c]) / 300.0;
            if (this->Slots[local_3c] <= 2.0 && this->Slots[local_3c] != 2.0) {
              this->Slots[local_3c] = 0.0;
            }
          }
          else {
            this->Slots[local_3c] = 0.0;
          }
        }
      }
      local_40 = (int)(((double)(int)damageType_local._4_4_ * _saved) / 100.0);
      if (_saved * 2.0 < (double)local_40) {
        local_40 = (int)(_saved * 2.0);
      }
      *local_28 = *local_28 - local_40;
      damageType_local._4_4_ = *local_28;
    }
  }
  bVar2 = TObjPtr<AInventory>::operator!=
                    (&(this->super_AArmor).super_AInventory.super_AActor.Inventory,(AInventory *)0x0
                    );
  if (bVar2) {
    pAVar3 = TObjPtr<AInventory>::operator->
                       (&(this->super_AArmor).super_AInventory.super_AActor.Inventory);
    uVar1 = damageType_local._4_4_;
    FName::FName(&local_44,damageType);
    (*(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3b])
              (pAVar3,(ulong)uVar1,&local_44,local_28);
  }
  return;
}

Assistant:

void AHexenArmor::AbsorbDamage (int damage, FName damageType, int &newdamage)
{
	if (!DamageTypeDefinition::IgnoreArmor(damageType))
	{
		double savedPercent = Slots[0] + Slots[1] + Slots[2] + Slots[3] + Slots[4];

		if (savedPercent)
		{ // armor absorbed some damage
			if (savedPercent > 100)
			{
				savedPercent = 100;
			}
			for (int i = 0; i < 4; i++)
			{
				if (Slots[i])
				{
					// 300 damage always wipes out the armor unless some was added
					// with the dragon skin bracers.
					if (damage < 10000)
					{
						Slots[i] -= damage * SlotsIncrement[i] / 300.;
						if (Slots[i] < 2)
						{
							Slots[i] = 0;
						}
					}
					else
					{
						Slots[i] = 0;
					}
				}
			}
			int saved = int(damage * savedPercent / 100.);
			if (saved > savedPercent*2)
			{	
				saved = int(savedPercent*2);
			}
			newdamage -= saved;
			damage = newdamage;
		}
	}
	if (Inventory != NULL)
	{
		Inventory->AbsorbDamage (damage, damageType, newdamage);
	}
}